

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeString(AsciiParser *this,StringData *str)

{
  ulong uVar1;
  StreamReader *pSVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  char c0;
  char c;
  char nc;
  stringstream ss;
  char local_209;
  string local_208;
  Cursor local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (str != (StringData *)0x0) {
    uVar1 = this->_sr->idx_;
    local_1e8 = this->_curr_cursor;
    uStack_1e0 = 0;
    bVar3 = Char1(this,&local_209);
    if ((bVar3) && ((local_209 == '\"' || (local_209 == '\'')))) {
      while ((bVar3 = Eof(this), !bVar3 && (bVar3 = Char1(this,(char *)&local_208), bVar3))) {
        if ((char)local_208._M_dataplus._M_p == '\\') {
          bVar3 = LookChar1(this,(char *)&local_1d8);
          if (!bVar3) goto LAB_00289db1;
          if ((char)local_1d8._M_dataplus._M_p == '\"') {
            pcVar5 = "\"";
          }
          else {
            if ((char)local_1d8._M_dataplus._M_p != '\'') goto LAB_00289d4a;
            pcVar5 = "\'";
          }
          ::std::operator<<(local_1a8,pcVar5);
          pSVar2 = this->_sr;
          if ((-2 < (long)pSVar2->idx_) && (uVar4 = pSVar2->idx_ + 1, uVar4 <= pSVar2->length_)) {
            pSVar2->idx_ = uVar4;
          }
        }
        else {
          if (((char)local_208._M_dataplus._M_p == '\r') ||
             ((char)local_208._M_dataplus._M_p == '\n')) break;
LAB_00289d4a:
          if (local_209 != '\'') {
            if ((char)local_208._M_dataplus._M_p != '\"') goto LAB_00289d5e;
LAB_00289dd1:
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            unescapeControlSequence(&local_208,&local_1d8);
            ::std::__cxx11::string::operator=((string *)str,(string *)&local_208);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            str->line_row = local_1e8.row;
            str->line_col = local_1e8.col;
            str->is_triple_quoted = false;
            (this->_curr_cursor).col =
                 (this->_curr_cursor).col + (int)local_208._M_string_length + 2;
            bVar3 = true;
            goto LAB_00289db3;
          }
          if ((char)local_208._M_dataplus._M_p == '\'') goto LAB_00289dd1;
LAB_00289d5e:
          ::std::operator<<(local_1a8,(char)local_208._M_dataplus._M_p);
        }
      }
    }
    if (uVar1 <= this->_sr->length_) {
      this->_sr->idx_ = uVar1;
    }
  }
LAB_00289db1:
  bVar3 = false;
LAB_00289db3:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return bVar3;
}

Assistant:

bool AsciiParser::MaybeString(value::StringData *str) {
  std::stringstream ss;

  if (!str) {
    return false;
  }

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  char c0;
  if (!Char1(&c0)) {
    SeekTo(loc);
    return false;
  }

  // ' or " allowed.
  if ((c0 != '"') && (c0 != '\'')) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = (c0 == '\'');

  bool end_with_quotation{false};

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      SeekTo(loc);
      return false;
    }

    if ((c == '\n') || (c == '\r')) {
      SeekTo(loc);
      return false;
    }

    if (c == '\\') {
      // escaped quote? \" \'
      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == '\'') {
        ss << "'";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      } else if (nc == '"') {
        ss << "\"";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      }
    }

    if (single_quote) {
      if (c == '\'') {
        end_with_quotation = true;
        break;
      }
    } else {
      if (c == '"') {
        end_with_quotation = true;
        break;
      }
    }

    ss << c;
  }

  if (!end_with_quotation) {
    SeekTo(loc);
    return false;
  }

  DCOUT("Single quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  size_t displayed_string_len = ss.str().size();
  str->value = unescapeControlSequence(ss.str());
  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = false;

  _curr_cursor.col += int(displayed_string_len + 2);  // +2 for quotation chars

  return true;
}